

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::Dictionary(Dictionary *this,shared_ptr<fasttext::Args> *args)

{
  reference pvVar1;
  shared_ptr<fasttext::Args> *in_RDI;
  int32_t i;
  shared_ptr<fasttext::Args> *in_stack_ffffffffffffff98;
  shared_ptr<fasttext::Args> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__new_size;
  vector<int,_std::allocator<int>_> *this_01;
  int local_20;
  
  this_00 = in_RDI;
  std::shared_ptr<fasttext::Args>::shared_ptr((shared_ptr<fasttext::Args> *)0x144a0a);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x144a1d);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x144a30);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x144a43);
  __new_size = &in_RDI[5].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::vector
            ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)0x144a56);
  this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 7);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x144a69);
  std::shared_ptr<fasttext::Args>::operator=(this_00,in_stack_ffffffffffffff98);
  *(undefined4 *)
   &in_RDI[8].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 0;
  *(undefined4 *)
   ((long)&in_RDI[8].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 4) = 0;
  *(undefined4 *)&in_RDI[9].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       0;
  *(undefined4 *)
   ((long)&in_RDI[9].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = 0;
  *(undefined4 *)
   &in_RDI[9].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 0;
  in_RDI[10].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::vector<int,_std::allocator<int>_>::resize(this_01,(size_type)__new_size);
  std::vector<int,_std::allocator<int>_>::resize(this_01,(size_type)__new_size);
  std::vector<int,_std::allocator<int>_>::resize(this_01,(size_type)__new_size);
  for (local_20 = 0; local_20 < 30000000; local_20 = local_20 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(this_00 + 1),(long)local_20);
    *pvVar1 = -1;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &this_00[2].super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(long)local_20);
    *pvVar1 = -1;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(this_00 + 4),(long)local_20);
    *pvVar1 = -1;
  }
  return;
}

Assistant:

Dictionary::Dictionary(std::shared_ptr<Args> args) {
  args_ = args;
  size_ = 0;
  lsize_ = 0;
  msize_ = 0;
  nwords_ = 0;
  nlabels_ = 0;
  ntokens_ = 0;
  word2int_.resize(MAX_VOCAB_SIZE);
  l2int_.resize(MAX_VOCAB_SIZE);
  m2int_.resize(MAX_VOCAB_SIZE);
  for (int32_t i = 0; i < MAX_VOCAB_SIZE; i++) {
    word2int_[i] = -1;
    l2int_[i] = -1;
    m2int_[i] = -1;
  }
}